

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_message.cc
# Opt level: O0

void __thiscall
absl::log_internal::LogMessage::LogMessageData::LogMessageData
          (LogMessageData *this,char *file,int line,LogSeverity severity,Time timestamp)

{
  long lVar1;
  bool bVar2;
  _Ios_Fmtflags __fmtfl;
  LogSeverity LVar3;
  pid_t pVar4;
  char *extraout_RDX;
  Span<char> SVar5;
  string_view filepath;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  string_view local_60;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  LogSeverity local_40;
  int local_3c;
  LogSeverity severity_local;
  int line_local;
  char *file_local;
  LogMessageData *this_local;
  uint32_t local_1c;
  HiRep local_14;
  Time timestamp_local;
  
  local_1c = timestamp.rep_.rep_lo_;
  register0x00000080 = timestamp.rep_.rep_hi_;
  local_40 = severity;
  local_3c = line;
  _severity_local = file;
  file_local = (char *)this;
  local_14 = register0x00000080;
  timestamp_local.rep_.rep_hi_.lo_ = local_1c;
  LogEntry::LogEntry(&this->entry);
  InlinedVector<absl::LogSink_*,_16UL,_std::allocator<absl::LogSink_*>_>::InlinedVector
            (&this->extra_sinks);
  this->extra_sinks_only = false;
  std::ostream::ostream(&this->manipulated,(streambuf *)0x0);
  SVar5 = MakeSpan<std::array<char,_15000UL>_>(&this->encoded_buf);
  this->encoded_remaining = SVar5;
  lVar1 = *(long *)(*(long *)&this->manipulated + -0x18);
  __fmtfl = std::operator|(_S_showbase,_S_boolalpha);
  std::ios_base::setf((ios_base *)(&this->manipulated + lVar1),__fmtfl);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_50,_severity_local);
  (this->entry).full_filename_._M_len = local_50._M_len;
  (this->entry).full_filename_._M_str = local_50._M_str;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_70,_severity_local);
  filepath._M_str = extraout_RDX;
  filepath._M_len = (size_t)local_70._M_str;
  local_60 = anon_unknown_2::Basename((anon_unknown_2 *)local_70._M_len,filepath);
  (this->entry).base_filename_._M_len = local_60._M_len;
  (this->entry).base_filename_._M_str = local_60._M_str;
  (this->entry).line_ = local_3c;
  bVar2 = ShouldPrependLogPrefix();
  (this->entry).prefix_ = bVar2;
  LVar3 = NormalizeLogSeverity(local_40);
  (this->entry).severity_ = LVar3;
  (this->entry).verbose_level_ = -1;
  (this->entry).timestamp_.rep_.rep_hi_ = local_14;
  (this->entry).timestamp_.rep_.rep_lo_ = timestamp_local.rep_.rep_hi_.lo_;
  pVar4 = base_internal::GetCachedTID();
  (this->entry).tid_ = pVar4;
  return;
}

Assistant:

LogMessage::LogMessageData::LogMessageData(const char* file, int line,
                                           absl::LogSeverity severity,
                                           absl::Time timestamp)
    : extra_sinks_only(false),
      manipulated(nullptr),
      // This `absl::MakeSpan` silences spurious -Wuninitialized from GCC:
      encoded_remaining(absl::MakeSpan(encoded_buf)) {
  // Legacy defaults for LOG's ostream:
  manipulated.setf(std::ios_base::showbase | std::ios_base::boolalpha);
  entry.full_filename_ = file;
  entry.base_filename_ = Basename(file);
  entry.line_ = line;
  entry.prefix_ = absl::ShouldPrependLogPrefix();
  entry.severity_ = absl::NormalizeLogSeverity(severity);
  entry.verbose_level_ = absl::LogEntry::kNoVerbosityLevel;
  entry.timestamp_ = timestamp;
  entry.tid_ = absl::base_internal::GetCachedTID();
}